

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O3

void __thiscall
VehicleState::Propagator::operator()(Propagator *this,state_type *x,state_type *dxdt,double t)

{
  undefined8 *puVar1;
  double Rearth;
  pointer pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  PointerType ptr;
  void *pvVar11;
  Index row;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int ii;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  state_type accel;
  Vector3d accelinit;
  state_type pos;
  state_type vel;
  MatrixXd dSTM;
  MatrixXd STM;
  MatrixXd jac;
  VectorXd eigcol_1;
  double local_328;
  vector<double,_std::allocator<double>_> local_260;
  Vector3d local_248;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_230;
  undefined8 local_228;
  long local_220;
  long local_218;
  vector<double,_std::allocator<double>_> local_210;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  vector<double,_std::allocator<double>_> local_198;
  undefined8 *local_180;
  long local_178;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_130;
  double local_128;
  void *local_120;
  long local_118;
  vector<double,_std::allocator<double>_> local_108;
  MatrixXd local_f0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98 [2];
  Vector3d local_88;
  Vector3d local_68;
  Vector3d local_48;
  
  local_158 = this->mu_;
  uStack_150 = 0;
  local_1c8 = this->J2_;
  Rearth = this->Rearth_;
  local_128 = this->J3_;
  pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *pdVar2;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar2[1];
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar2[2];
  __l._M_len = 3;
  __l._M_array = (iterator)&local_248;
  std::vector<double,_std::allocator<double>_>::vector(&local_210,__l,(allocator_type *)&local_198);
  pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       pdVar2[3];
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       pdVar2[4];
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       pdVar2[5];
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_248;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_198,__l_00,(allocator_type *)&local_260);
  local_c8 = this->earthrotationspeed_;
  uStack_c0 = 0;
  local_1a0 = this->C_D_;
  local_1a8 = this->A_;
  local_148 = this->m_;
  uStack_140 = 0;
  local_1b0 = this->rho_0_;
  local_1c0 = this->r0_;
  local_1b8 = this->H_;
  local_1d8 = this->AU_;
  uStack_1d0 = 0;
  local_b8 = this->mu_sun_;
  uStack_b0 = 0;
  local_a8 = this->mu_moon_;
  uStack_a0 = 0;
  pdVar3 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar40 = *pdVar3;
  dVar44 = pdVar3[1];
  dVar39 = pdVar3[2];
  dVar18 = *local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  dVar19 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  dVar37 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  dVar17 = t / 86400.0 + this->t_JD_;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_248;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_260,__l_01,(allocator_type *)&local_f0);
  local_d8 = SQRT(dVar37 * dVar37 + dVar19 * dVar19 + dVar18 * dVar18);
  uStack_d0 = 0;
  if (this->use20x20_ == true) {
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = dVar40;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = dVar44;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = dVar39;
    Util::EGM96Grav::GetGravAccel(&local_248,this->gravmodel_,&local_48,dVar17);
    *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start +
                local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] +
                  local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
    dVar18 = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2] +
             local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[2];
LAB_00110550:
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = dVar18;
  }
  else {
    local_328 = -local_158;
    dVar18 = pow(local_d8,3.0);
    local_328 = local_328 / dVar18;
    *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start * local_328 +
                *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] * local_328 +
                  local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = local_328 *
                  local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] +
                  local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
    if (this->useJ2_ == true) {
      dVar19 = *local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar23 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1] *
               local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      dVar22 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] *
               local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2];
      dVar37 = Rearth * Rearth * local_1c8 * local_158;
      dVar21 = dVar19 * dVar19 + dVar23;
      dVar51 = dVar22 * -4.0 + dVar21;
      dVar21 = dVar21 + dVar22;
      dVar52 = pow(dVar21,3.5);
      dVar18 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1];
      dVar20 = pow(dVar21,3.5);
      local_1f8 = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] * dVar37;
      dVar21 = pow(dVar21,3.5);
      auVar34._0_8_ = dVar51 * dVar37 * dVar19;
      auVar34._8_8_ = dVar51 * dVar37 * dVar18;
      auVar49._8_8_ = dVar20;
      auVar49._0_8_ = dVar52;
      auVar34 = divpd(auVar34,auVar49);
      *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start = *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + auVar34._0_8_ * -1.5;
      local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[1] + auVar34._8_8_ * -1.5;
      dVar18 = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[2] -
               ((dVar19 * dVar19 * 3.0 + dVar23 * 3.0) - (dVar22 + dVar22)) * (local_1f8 / dVar21) *
               1.5;
      goto LAB_00110550;
    }
  }
  if (this->usedrag_ == true) {
    dVar18 = local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2];
    dVar37 = local_1a0 * 500.0 * local_1a8;
    dVar51 = local_c8 *
             local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1] +
             *local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar52 = -local_c8 *
             *local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start +
             local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    dVar19 = exp(-(local_d8 - local_1c0) / local_1b8);
    dVar19 = dVar19 * local_1b0 * dVar37 * SQRT(dVar52 * dVar52 + dVar51 * dVar51 + dVar18 * dVar18)
    ;
    auVar50._0_8_ = dVar19 * dVar51;
    auVar50._8_8_ = dVar19 * dVar52;
    auVar53._8_8_ = local_148;
    auVar53._0_8_ = local_148;
    auVar34 = divpd(auVar50,auVar53);
    *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start - auVar34._0_8_;
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1] - auVar34._8_8_;
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] - (dVar18 * dVar19) / local_148;
  }
  dVar37 = (dVar17 + -2451545.0) / 36525.0;
  dVar51 = dVar37 * 35999.050957 + 357.528;
  dVar18 = sin(dVar51 * 0.017453292519943295);
  dVar19 = (dVar51 + dVar51) * 0.017453292519943295;
  dVar17 = sin(dVar19);
  dVar51 = cos(dVar51 * 0.017453292519943295);
  dVar19 = cos(dVar19);
  dVar51 = dVar19 * -0.000139589 + dVar51 * -0.016708617 + 1.000140612;
  dVar52 = dVar37 * -0.0130042 + 23.439291;
  dVar18 = (dVar17 * 0.019994643 + dVar18 * 1.914666471 + dVar37 * 36000.771285 + 280.46) *
           0.017453292519943295;
  dVar19 = cos(dVar18);
  dVar17 = dVar52 * 0.017453292519943295;
  dVar20 = cos(dVar17);
  dVar21 = sin(dVar18);
  dVar22 = local_1d8 * dVar19 * dVar51;
  dVar20 = local_1d8 * dVar21 * dVar20 * dVar51;
  dVar19 = sin(dVar17);
  dVar18 = sin(dVar18);
  dVar17 = dVar19 * dVar51 * dVar18 * local_1d8;
  dVar18 = dVar22 - dVar40;
  dVar19 = dVar20 - dVar44;
  dVar21 = dVar17 - dVar39;
  if (this->useSRP_ == true) {
    dVar23 = dVar39 * dVar17 + dVar44 * dVar20 + dVar40 * dVar22;
    if (dVar23 < 0.0) {
      dVar45 = SQRT(dVar39 * dVar39 + dVar44 * dVar44 + dVar40 * dVar40);
      local_1f8 = dVar18;
      dStack_1f0 = dVar19;
      dVar18 = acos(-dVar23 / (SQRT(dVar17 * dVar17 + dVar20 * dVar20 + dVar22 * dVar22) * dVar45));
      dVar23 = cos(dVar18);
      dVar24 = sin(dVar18);
      dVar18 = local_1f8;
      dVar19 = dStack_1f0;
      if (dVar24 * dVar45 <=
          (Rearth / 0.0046950441895121445 + dVar23 * dVar45) * 0.004695095937829986)
      goto LAB_00110a35;
    }
    auVar41._0_8_ = dVar19 * dVar19 + dVar18 * dVar18;
    auVar41._8_8_ = dVar19 * dVar19;
    auVar35._0_8_ = dVar21 * dVar21 + auVar41._0_8_;
    auVar35._8_8_ = 0;
    auVar34 = sqrtpd(auVar41,auVar35);
    auVar42._0_8_ = auVar34._0_8_;
    auVar42._8_8_ = auVar42._0_8_;
    auVar46._8_8_ = dVar19;
    auVar46._0_8_ = dVar18;
    auVar34 = divpd(auVar46,auVar42);
    auVar43._0_8_ = local_148 * 1000.0;
    auVar47._0_8_ = auVar34._0_8_ * -0.00012339;
    auVar47._8_8_ = auVar34._8_8_ * -0.00012339;
    auVar43._8_8_ = auVar43._0_8_;
    auVar34 = divpd(auVar47,auVar43);
    *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = auVar34._0_8_ +
                *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = auVar34._8_8_ +
                  local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2] -
                  ((dVar21 / auVar42._0_8_) * 0.00012339) / auVar43._0_8_;
  }
LAB_00110a35:
  if (this->useLuniSolar_ == true) {
    dVar38 = (dVar37 * 477198.85 + 134.9) * 0.017453292519943295;
    local_1f8 = dVar18;
    dStack_1f0 = dVar19;
    dVar18 = sin(dVar38);
    dVar19 = (dVar37 * -413335.38 + 259.2) * 0.017453292519943295;
    dVar23 = sin(dVar19);
    dVar24 = sin((dVar37 * 890543.23 + 235.7) * 0.017453292519943295);
    local_1e8 = (dVar37 * 954397.7 + 269.9) * 0.017453292519943295;
    dVar45 = sin(local_1e8);
    dVar25 = sin((dVar37 * 35999.05 + 357.5) * 0.017453292519943295);
    dVar26 = sin(dVar37 * 966404.05 + 186.6);
    dVar27 = sin((dVar37 * 483202.03 + 93.3) * 0.017453292519943295);
    dVar28 = sin((dVar37 * 960400.87 + 228.2) * 0.017453292519943295);
    dVar29 = sin((dVar37 * 6003.18 + 318.3) * 0.017453292519943295);
    dVar30 = sin((dVar37 * -407332.2 + 217.6) * 0.017453292519943295);
    dVar38 = cos(dVar38);
    dVar19 = cos(dVar19);
    dVar31 = cos((dVar37 * 890534.23 + 235.7) * 0.017453292519943295);
    dVar32 = cos(local_1e8);
    dVar33 = pow(dVar37,3.0);
    dVar19 = sin((dVar32 * 0.0028 + dVar31 * 0.0078 + dVar19 * 0.0095 + dVar38 * 0.0518 + 0.9508) *
                 0.017453292519943295);
    dVar19 = Rearth / dVar19;
    dVar27 = (dVar30 * -0.17 + dVar29 * -0.28 + dVar28 * 0.28 + dVar27 * 5.13) *
             0.017453292519943295;
    local_1e8 = cos(dVar27);
    dVar18 = (dVar26 * -0.11 +
             dVar25 * -0.19 +
             dVar45 * 0.21 +
             dVar24 * 0.66 + dVar23 * -1.27 + dVar18 * 6.29 + dVar37 * 481267.8813 + 218.32) *
             0.017453292519943295;
    local_168 = cos(dVar18);
    local_1e8 = local_1e8 * dVar19;
    dVar26 = (dVar33 * 5.04e-07 + dVar37 * dVar37 * -1.6399999999999999e-07 + dVar52) *
             0.017453292519943295;
    dVar37 = cos(dVar26);
    dVar52 = cos(dVar27);
    dVar23 = sin(dVar18);
    local_130 = sin(dVar26);
    dVar24 = sin(dVar27);
    dVar24 = dVar24 * local_130;
    dVar45 = sin(dVar26);
    dVar25 = cos(dVar27);
    dVar18 = sin(dVar18);
    dVar26 = cos(dVar26);
    dVar27 = sin(dVar27);
    dVar45 = (dVar25 * dVar45 * dVar18 + dVar27 * dVar26) * dVar19;
    dVar39 = dVar45 - dVar39;
    dVar18 = pow(SQRT(dVar21 * dVar21 + dStack_1f0 * dStack_1f0 + local_1f8 * local_1f8),3.0);
    local_1d8 = pow(local_1d8 * dVar51,3.0);
    dVar17 = dVar17 / local_1d8;
    local_168 = local_168 * local_1e8;
    dStack_160 = (dVar52 * dVar37 * dVar23 - dVar24) * dVar19;
    dVar40 = local_168 - dVar40;
    dVar44 = dStack_160 - dVar44;
    uStack_1d0 = extraout_XMM0_Qb;
    dVar37 = pow(SQRT(dVar44 * dVar44 + dVar40 * dVar40 + dVar39 * dVar39),3.0);
    auVar36._0_8_ = pow(dVar19,3.0);
    auVar48._8_8_ = dVar18;
    auVar48._0_8_ = dVar18;
    auVar9._8_8_ = dStack_1f0;
    auVar9._0_8_ = local_1f8;
    auVar50 = divpd(auVar9,auVar48);
    auVar8._8_8_ = dVar20;
    auVar8._0_8_ = dVar22;
    auVar4._8_8_ = local_1d8;
    auVar4._0_8_ = local_1d8;
    auVar49 = divpd(auVar8,auVar4);
    auVar7._8_8_ = dVar44;
    auVar7._0_8_ = dVar40;
    auVar5._8_8_ = dVar37;
    auVar5._0_8_ = dVar37;
    auVar34 = divpd(auVar7,auVar5);
    auVar36._8_8_ = auVar36._0_8_;
    auVar10._8_8_ = dStack_160;
    auVar10._0_8_ = local_168;
    auVar53 = divpd(auVar10,auVar36);
    *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = local_a8 * (auVar34._0_8_ - auVar53._0_8_) +
                local_b8 * (auVar50._0_8_ - auVar49._0_8_) +
                *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = local_a8 * (auVar34._8_8_ - auVar53._8_8_) +
                  local_b8 * (auVar50._8_8_ - auVar49._8_8_) +
                  local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
    local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = (dVar39 / dVar37 - dVar45 / auVar36._0_8_) * local_a8 +
                  (dVar21 / dVar18 - dVar17) * local_b8 +
                  local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[2];
  }
  if (this->intSTM_ == true) {
    dVar39 = exp(-(local_d8 - local_1c0) / local_1b8);
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2];
    Util::GetGravJac(&local_f0,&local_68,&local_88,Rearth,local_c8,local_158,local_1c8,local_128,
                     (local_1a0 * 500000.0 * local_1a8 * local_1b0 * dVar39) / local_148);
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 2.96439387504748e-323;
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 2.96439387504748e-323;
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_120,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_248);
    lVar16 = 0;
    lVar15 = 0;
    do {
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = 0.0;
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)operator_new(0x30);
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] + 0x30);
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x20) = 0.0;
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x28) = 0.0;
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x10) = 0.0;
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x18) = 0.0;
      *(double *)
       local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] = 0.0;
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 8) = 0.0;
      pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)
       local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0] = pdVar2[lVar15 * 6 + 6];
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 8) = pdVar2[lVar15 * 6 + 7];
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x10) = pdVar2[lVar15 * 6 + 8];
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x18) = pdVar2[lVar15 * 6 + 9];
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x20) = pdVar2[lVar15 * 6 + 10];
      *(double *)
       ((long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] + 0x28) = pdVar2[lVar15 * 6 + 0xb];
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      std::vector<double,_std::allocator<double>_>::vector
                (&local_108,(vector<double,_std::allocator<double>_> *)&local_248);
      Util::StdVec2Eigen((Util *)&local_180,&local_108);
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      puVar1 = (undefined8 *)((long)local_120 + local_118 * lVar15 * 8);
      if (((ulong)puVar1 & 7) == 0) {
        uVar14 = (uint)((ulong)puVar1 >> 3) & 1;
        if (((ulong)puVar1 >> 3 & 1) != 0) {
          *puVar1 = *local_180;
        }
        pvVar11 = (void *)((long)local_120 + local_118 * lVar16);
        uVar13 = (ulong)uVar14;
        do {
          uVar6 = (local_180 + uVar13)[1];
          puVar1 = (undefined8 *)((long)pvVar11 + uVar13 * 8);
          *puVar1 = local_180[uVar13];
          puVar1[1] = uVar6;
          uVar13 = uVar13 + 2;
        } while (uVar13 < (6 - uVar14 & 0xfffffffe | uVar14));
        if ((ulong)uVar14 != 0) {
          uVar13 = (ulong)(6 - (((uint)pvVar11 >> 3 & 1) != 0) & 0xfffffffe |
                          (uint)((ulong)pvVar11 >> 3) & 1) - 1;
          do {
            *(undefined8 *)((long)pvVar11 + uVar13 * 8 + 8) = local_180[uVar13 + 1];
            uVar13 = uVar13 + 1;
          } while (uVar13 < 5);
        }
      }
      else {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)local_120 + lVar12 * 8 + local_118 * lVar16) = local_180[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
      }
      free(local_180);
      if ((double *)
          local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] != (double *)0x0) {
        operator_delete((void *)local_248.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array[0],
                        (long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[2] -
                        (long)local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              .m_storage.m_data.array[0]);
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar15 != 6);
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)&local_f0;
    local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)&local_120;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_180,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_248);
    lVar15 = 0x58;
    lVar16 = 0;
    do {
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)(local_180 + local_178 * lVar16);
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = 2.96439387504748e-323;
      local_248.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_228 = 0;
      local_218 = local_178;
      local_230 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_180;
      local_220 = lVar16;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)&local_248);
      pdVar2 = (dxdt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pdVar2 + lVar15 + -0x28) = *local_98[0];
      *(undefined8 *)((long)pdVar2 + lVar15 + -0x20) = local_98[0][1];
      *(undefined8 *)((long)pdVar2 + lVar15 + -0x18) = local_98[0][2];
      *(undefined8 *)((long)pdVar2 + lVar15 + -0x10) = local_98[0][3];
      *(undefined8 *)((long)pdVar2 + lVar15 + -8) = local_98[0][4];
      *(undefined8 *)((long)pdVar2 + lVar15) = local_98[0][5];
      free(local_98[0]);
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x30;
    } while (lVar16 != 6);
    free(local_180);
    free(local_120);
    free(local_f0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
  }
  pdVar3 = (dxdt->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar3 = *local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  pdVar3[1] = local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1];
  pdVar3[2] = local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[2];
  pdVar3[3] = *local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
  pdVar3[4] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[1];
  pdVar3[5] = local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[2];
  operator_delete(local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Propagator::operator()  (const state_type &x , state_type &dxdt , const double t){
		
		//extract locals
		double mu = this->mu_;
		double Rearth = this->Rearth_;
		double J2 = this->J2_;
		double J3 = this->J3_;
		state_type pos = {x[0], x[1], x[2]};
		state_type vel = {x[3], x[4], x[5]};
		double earthrot = this->earthrotationspeed_;
		double C_D = this->C_D_; // coefficient of drag
		double A = this->A_; // effective area, m^2
		double m = this->m_; // vehicle mass, kg
		double rho_0 = this->rho_0_; // standard air density, kg/m^3
		double r0 = this->r0_; // param for air density calc, km
		double H = this->H_; //param for air density calc, km
		double t_JD_init = this->t_JD_; //UTC julian date at initialization
		double AU2km = this->AU_;
		double mu_sun = this->mu_sun_;
		double mu_moon = this->mu_moon_;

		//initialize some variables we may need
		Eigen::Vector3d r_sun_ECI; //position of the sun in ECI frame [km]
		Eigen::Vector3d r_craft2sun; //ECI position from craft to sun [km]
		Eigen::Vector3d r_moon_ECI; //position of the moon in ECI frame [km]
		Eigen::Vector3d r_craft2moon; //ECI position from craft to moon [km]
		Eigen::Vector3d r_craft(x[0], x[1], x[2]); //eigen position vector for spacecraft [km]

		//intermediate calcs
		double r2 = pow(pos[0],2.0) + pow(pos[1],2.0) + pow(pos[2],2.0);
		double r = sqrt(r2);
		double JD_UTC = t_JD_init + t/(24.0*60.0*60.0); //current UTC Julian Date in days
		double d2r = M_PI/180.0; //degrees to radians

		// std::cout << "t: " << t << " state: " << x[0] << " " << x[1] << " " << x[2] << " " << x[3] << " " << x[4] << " " << x[5]; 

		//initalize acceleration
		state_type accel = {0.0, 0.0, 0.0};
		
		if(this->use20x20_){

			Eigen::Vector3d accelinit = this->gravmodel_->GetGravAccel(r_craft, JD_UTC);

			accel[0] = accel[0] + accelinit[0];
			accel[1] = accel[1] + accelinit[1];
			accel[2] = accel[2] + accelinit[2];

		} else {

			//two body acceleration
			double k = -mu/pow(r,3);
			accel[0] = accel[0] + k*pos[0];
			accel[1] = accel[1] + k*pos[1];
			accel[2] = accel[2] + k*pos[2];

			if (this->useJ2_) { // J-2 accel
				
				double t2 = pow(pos[0],2);
				double t3 = pow(pos[1],2);
				double t4 = pow(pos[2],2);
				double accel_j2_x = J2*pow(Rearth,2)*mu*pos[0]*(t2+t3-t4*4.0)*1.0/pow(t2+t3+t4,7.0/2.0)*(-3.0/2.0);
				double accel_j2_y = J2*pow(Rearth,2)*mu*pos[1]*(t2+t3-t4*4.0)*1.0/pow(t2+t3+t4,7.0/2.0)*(-3.0/2.0);
				double accel_j2_z = J2*pow(Rearth,2)*mu*pos[2]*1.0/pow(t2+t3+t4,7.0/2.0)*(t2*3.0+t3*3.0-t4*2.0)*(-3.0/2.0);

				// add J2 acceleration
				accel[0] = accel[0] + accel_j2_x;
				accel[1] = accel[1] + accel_j2_y;
				accel[2] = accel[2] + accel_j2_z;
			} // fi

		}	

		if (this->usedrag_) { // drag acceleration 
			
			//relative wind vector
			Eigen::Vector3d V_A;
			V_A[0] = vel[0] + earthrot*pos[1];
			V_A[1] = vel[1] - earthrot*pos[0];
			V_A[2] = vel[2];
			double nV_A = V_A.norm(); //magnitude

			//current air density
			double rho_A = rho_0*exp(-(r - r0)/H);

			//add drag acceleration (extra 1000 for unit conversion)
			accel[0] = accel[0] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[0]/m;
			accel[1] = accel[1] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[1]/m;
			accel[2] = accel[2] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[2]/m;

		} //fi

		//first, find the position of the sun in the ECI frame (vallado algo 29)

		//assume JD_UTC = JD_UT1 (less than 1 second deviation)
		double T_UT1 = (JD_UTC - 2451545.0)/36525.0; // julian centuries
		// double T_UT1 = (2453827.5 - 2451545.0)/36525.0; // vallado numbers for checking
		double lambda_M_sun = 280.460 + 36000.771285*T_UT1; // mean sun longitude [degrees]

		//assume T_TBD = T_UT1
		double M_sun = 357.528 + 35999.050957*T_UT1; // mean sun something [degrees]
		double lambda_ecliptic = lambda_M_sun + 1.914666471*sin(M_sun*d2r) + 0.019994643*sin(2*M_sun*d2r);

		//norm of position to sun [AU]
		double r_sun_ECI_norm = 1.000140612 - 0.016708617*cos(M_sun*d2r) - 0.000139589*cos(2*M_sun*d2r);
		double eps = 23.439291 - 0.0130042*T_UT1; //ecentricity of sun orbit?

		//position of sun
		r_sun_ECI[0] = r_sun_ECI_norm*cos(lambda_ecliptic*d2r)*AU2km;
		r_sun_ECI[1] = r_sun_ECI_norm*cos(eps*d2r)*sin(lambda_ecliptic*d2r)*AU2km;
		r_sun_ECI[2] = r_sun_ECI_norm*sin(eps*d2r)*sin(lambda_ecliptic*d2r)*AU2km;

		//relative direction of sun in ECI frame
		r_craft2sun = r_sun_ECI - r_craft;

		bool in_sun = true; //boolean to track if we are in the sun or not

		if (this->useSRP_) { //SRP acceleration

			//check to see if we are in the earth's shadow (vallado algo 34)
			double sundotcraft = r_sun_ECI.dot(r_craft);
			if (sundotcraft < 0)	{ // if positive we are between sun and earth

				//constants for earth shadow
				double alpha_pen = 0.269007205*d2r;
				
				//find the angle between the two [radians]
				double xi = acos(-1.0*sundotcraft/(r_sun_ECI.norm()*r_craft.norm()));

				//satellite horizontal and vertical position
				double sat_horiz = r_craft.norm()*cos(xi);
				double sat_vert = r_craft.norm()*sin(xi);

				double x = Rearth/sin(alpha_pen);

				double pen_vert = tan(alpha_pen)*(x+sat_horiz);
				if(sat_vert <= pen_vert) {
					in_sun = false; //consider only penumbra
				} //fi

			} //fi

			//if we are in the sun, add the SRP force
			if (in_sun)	{
				
				//approximate Area * C_s
				// double SRPcoeff = 0.04*15.0 + 0.59*7.0;
				double SRPcoeff = 1.8*15.0;

				//vallado srp
				double p_srp = 4.57*pow(10.0,-6.0);

				//normalize
				Eigen::Vector3d r_craft2sun_norm = r_craft2sun/r_craft2sun.norm();

				//add SRP acceleration (extra 1000 for unit conversion)
				accel[0] = accel[0] - SRPcoeff*p_srp*r_craft2sun_norm[0]/(1000.0*m);
				accel[1] = accel[1] - SRPcoeff*p_srp*r_craft2sun_norm[1]/(1000.0*m);
				accel[2] = accel[2] - SRPcoeff*p_srp*r_craft2sun_norm[2]/(1000.0*m);
			}


		} //fi

		if (this->useLuniSolar_) { //gravitational effects of the sun and moon

			//first, find the position of the moon in the ECI frame (vallado algo 31)

			//assume JD_UTC = JD_TBD
			// double T_TBD = (2449470.5 - 2451545.0)/36525.0; // vallado numbers
			double T_TBD = (JD_UTC - 2451545.0)/36525.0; // julian centuries
			
			double lambda_ecliptic = 218.32 + 481267.8813*T_TBD + 6.29*sin(d2r*(134.9 + 477198.85*T_TBD))
				- 1.27*sin(d2r*(259.2 - 413335.38*T_TBD)) + 0.66*sin(d2r*(235.7 + 890543.23*T_TBD))
				+ 0.21*sin(d2r*(269.9+954397.70*T_TBD)) - 0.19*sin(d2r*(357.5 + 35999.05*T_TBD))
				- 0.11*sin(186.6 + 966404.05*T_TBD);

			double phi_ecliptic = 5.13*sin(d2r*(93.3 + 483202.03*T_TBD)) + 0.28*sin(d2r*(228.2 + 960400.87*T_TBD))
				- 0.28*sin(d2r*(318.3 + 6003.18*T_TBD)) - 0.17*sin(d2r*(217.6 - 407332.20*T_TBD));

			double D = 0.9508 + 0.0518*cos(d2r*(134.9 + 477198.85*T_TBD)) + 0.0095*cos(d2r*(259.2 - 413335.38*T_TBD))
				+ 0.0078*cos(d2r*(235.7 + 890534.23*T_TBD)) + 0.0028*cos(d2r*(269.9 + 954397.70*T_TBD));

			double eps = 23.439291 - 0.0130042*T_TBD - 1.64*pow(10.0,-7.0)*pow(T_TBD,2.0) + 5.04*pow(10.0,-7.0)*pow(T_TBD,3.0);

			double r_moon_ECI_norm = Rearth/sin(d2r*D);

			r_moon_ECI[0] = r_moon_ECI_norm*cos(d2r*phi_ecliptic)*cos(d2r*lambda_ecliptic);
			r_moon_ECI[1] = r_moon_ECI_norm*(cos(eps*d2r)*cos(d2r*phi_ecliptic)*sin(d2r*lambda_ecliptic) - sin(d2r*eps)*sin(d2r*phi_ecliptic));
			r_moon_ECI[2] = r_moon_ECI_norm*(sin(eps*d2r)*cos(d2r*phi_ecliptic)*sin(d2r*lambda_ecliptic) + cos(d2r*eps)*sin(d2r*phi_ecliptic));

			//relative direction of moon in ECI frame
			r_craft2moon = r_moon_ECI - r_craft;

			//intermediate calcs
			double r2 = pow(pos[0],2.0) + pow(pos[1],2.0) + pow(pos[2],2.0);
			double r = sqrt(r2);
			double r3craft2sun = pow(r_craft2sun.norm(),3.0);
			double r3earth2sun = pow(AU2km*r_sun_ECI_norm,3.0);
			double r3craft2moon = pow(r_craft2moon.norm(),3.0);
			double r3earth2moon = pow(r_moon_ECI_norm,3.0);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";

			//two body acceleration to sun
			accel[0] = accel[0] + mu_sun*(r_craft2sun[0]/r3craft2sun - r_sun_ECI[0]/r3earth2sun);
			accel[1] = accel[1] + mu_sun*(r_craft2sun[1]/r3craft2sun - r_sun_ECI[1]/r3earth2sun);
			accel[2] = accel[2] + mu_sun*(r_craft2sun[2]/r3craft2sun - r_sun_ECI[2]/r3earth2sun);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";

			//two body acceleration to moon
			accel[0] = accel[0] + mu_moon*(r_craft2moon[0]/r3craft2moon - r_moon_ECI[0]/r3earth2moon);
			accel[1] = accel[1] + mu_moon*(r_craft2moon[1]/r3craft2moon - r_moon_ECI[1]/r3earth2moon);
			accel[2] = accel[2] + mu_moon*(r_craft2moon[2]/r3craft2moon - r_moon_ECI[2]/r3earth2moon);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";
			// exit(0);
			
		}

		//integrate the STM if needed
		if (this->intSTM_) {

			//current air density
			double rho_A = rho_0*exp(-(r - r0)/H);
			double drag_coeff = 1000.0*1000.0*0.5*C_D*A*rho_A/m;

			//get the jacobian
			Eigen::Vector3d eigpos(pos.data());
			Eigen::Vector3d eigvel(vel.data());
			Eigen::MatrixXd jac = Util::GetGravJac(eigpos, eigvel, Rearth, earthrot, mu, J2, J3, drag_coeff);

			//extract the STM
			Eigen::MatrixXd STM = Eigen::MatrixXd::Zero(6,6);

			for (int ii = 0; ii < 6; ++ii) {

				std::vector<double> col(6,0);
				col[0] = x[6*ii + 0 + 6];
				col[1] = x[6*ii + 1 + 6];
				col[2] = x[6*ii + 2 + 6];
				col[3] = x[6*ii + 3 + 6];
				col[4] = x[6*ii + 4 + 6];
				col[5] = x[6*ii + 5 + 6];

				//convert to eigen
				Eigen::VectorXd eigcol = Util::StdVec2Eigen(col);

				//assign
				STM.block(0,ii,6,1) = eigcol;

			} // for


			//change in STM
			Eigen::MatrixXd dSTM = jac*STM;

			//assign
			for (int ii = 0; ii < 6; ++ii) {
				Eigen::VectorXd eigcol = dSTM.block(0,ii,6,1);

				dxdt[6*ii + 0 + 6] = eigcol[0];
				dxdt[6*ii + 1 + 6] = eigcol[1];
				dxdt[6*ii + 2 + 6] = eigcol[2];
				dxdt[6*ii + 3 + 6] = eigcol[3];
				dxdt[6*ii + 4 + 6] = eigcol[4];
				dxdt[6*ii + 5 + 6] = eigcol[5];

			} // for


			
		} //fi


		//change in state
		dxdt[0] = vel[0];
		dxdt[1] = vel[1];
		dxdt[2] = vel[2];
		dxdt[3] = accel[0];
		dxdt[4] = accel[1];
		dxdt[5] = accel[2];

		// std::cout << "simple accel: \n" << accel[0] << "\n" << accel[1] << "\n" << accel[2] << "\n";

		// exit(0);

	}